

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
_IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStartedResponse>(string *proto_data)

{
  int iVar1;
  NotifyDataSourceStartedResponse *this;
  undefined8 *in_RSI;
  
  this = (NotifyDataSourceStartedResponse *)operator_new(0x30);
  perfetto::protos::gen::NotifyDataSourceStartedResponse::NotifyDataSourceStartedResponse(this);
  iVar1 = (*(this->super_CppMessageObj)._vptr_CppMessageObj[4])(this,*in_RSI,in_RSI[1]);
  if ((char)iVar1 == '\0') {
    (*(this->super_CppMessageObj)._vptr_CppMessageObj[1])(this);
    this = (NotifyDataSourceStartedResponse *)0x0;
  }
  (proto_data->_M_dataplus)._M_p = (pointer)this;
  return (__uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
          )(__uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
            )proto_data;
}

Assistant:

::std::unique_ptr<::perfetto::ipc::ProtoMessage> _IPC_Decoder(
    const std::string& proto_data) {
  ::std::unique_ptr<::perfetto::ipc::ProtoMessage> msg(new T());
  if (msg->ParseFromString(proto_data))
    return msg;
  return nullptr;
}